

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

bool __thiscall
cmStringCommand::RegexMatchAll
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *this_00;
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  char *pcVar4;
  _Alloc_hider string;
  string output;
  string e_1;
  string input;
  string regex;
  string outvar;
  RegularExpression re;
  undefined1 local_1e0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  undefined1 local_1b0 [16];
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140;
  char *local_120;
  undefined8 local_118;
  char local_110 [16];
  RegularExpression local_100;
  
  std::__cxx11::string::string
            ((string *)&local_180,
             (string *)
             ((args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + 2));
  std::__cxx11::string::string
            ((string *)&local_140,
             (string *)
             ((args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + 3));
  cmMakefile::ClearMatches((this->super_cmCommand).Makefile);
  local_100.program = (char *)0x0;
  bVar3 = cmsys::RegularExpression::compile(&local_100,local_180._M_dataplus._M_p);
  if (bVar3) {
    local_1e0._8_8_ =
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    local_1e0._0_8_ =
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start + 4;
    local_120 = local_110;
    local_118 = 0;
    local_110[0] = '\0';
    cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&local_1a0,
               (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)local_1e0,local_120);
    std::__cxx11::string::~string((string *)&local_120);
    local_1e0._0_8_ = local_1e0 + 0x10;
    local_1e0._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_1e0[0x10] = '\0';
    string._M_p = local_1a0._M_dataplus._M_p;
    while( true ) {
      bVar3 = cmsys::RegularExpression::find(&local_100,string._M_p);
      this_00 = (this->super_cmCommand).Makefile;
      if (!bVar3) break;
      cmMakefile::StoreMatches(this_00,&local_100);
      pcVar2 = local_100.searchstring;
      pcVar1 = local_100.endp[0];
      pcVar4 = local_100.startp[0];
      if (local_100.endp[0] == local_100.startp[0]) {
        std::operator+(&local_160,"sub-command REGEX, mode MATCHALL regex \"",&local_180);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c0,&local_160,"\" matched an empty string.");
        std::__cxx11::string::~string((string *)&local_160);
        cmCommand::SetError(&this->super_cmCommand,(string *)&local_1c0);
        std::__cxx11::string::~string((string *)local_1c0._M_local_buf);
        goto LAB_00316c7d;
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::__cxx11::string::append(local_1e0);
      }
      pcVar4 = string._M_p + ((long)pcVar4 - (long)pcVar2);
      local_1c0._M_allocated_capacity = (size_type)local_1b0;
      string._M_p = string._M_p + ((long)pcVar1 - (long)pcVar2);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,pcVar4,string._M_p);
      std::__cxx11::string::append((string *)local_1e0);
      std::__cxx11::string::~string((string *)local_1c0._M_local_buf);
    }
    cmMakefile::AddDefinition(this_00,&local_140,(char *)local_1e0._0_8_);
LAB_00316c7d:
    bVar3 = !bVar3;
    std::__cxx11::string::~string((string *)local_1e0);
    std::__cxx11::string::~string((string *)&local_1a0);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
                   "sub-command REGEX, mode MATCHALL failed to compile regex \"",&local_180);
    std::operator+(&local_1a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
                   "\".");
    std::__cxx11::string::~string((string *)local_1e0);
    cmCommand::SetError(&this->super_cmCommand,&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    bVar3 = false;
  }
  cmsys::RegularExpression::~RegularExpression(&local_100);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_180);
  return bVar3;
}

Assistant:

bool cmStringCommand::RegexMatchAll(std::vector<std::string> const& args)
{
  //"STRING(REGEX MATCHALL <regular_expression> <output variable> <input>
  // [<input>...])\n";
  std::string regex = args[2];
  std::string outvar = args[3];

  this->Makefile->ClearMatches();
  // Compile the regular expression.
  cmsys::RegularExpression re;
  if(!re.compile(regex.c_str()))
    {
    std::string e =
      "sub-command REGEX, mode MATCHALL failed to compile regex \""+
      regex+"\".";
    this->SetError(e);
    return false;
    }

  // Concatenate all the last arguments together.
  std::string input = cmJoin(cmMakeRange(args).advance(4), std::string());

  // Scan through the input for all matches.
  std::string output;
  const char* p = input.c_str();
  while(re.find(p))
    {
    this->Makefile->StoreMatches(re);
    std::string::size_type l = re.start();
    std::string::size_type r = re.end();
    if(r-l == 0)
      {
      std::string e = "sub-command REGEX, mode MATCHALL regex \""+
        regex+"\" matched an empty string.";
      this->SetError(e);
      return false;
      }
    if(!output.empty())
      {
      output += ";";
      }
    output += std::string(p+l, r-l);
    p += r;
    }

  // Store the output in the provided variable.
  this->Makefile->AddDefinition(outvar, output.c_str());
  return true;
}